

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIf(InstructionCreater *this,Node *node,Element *refelt)

{
  bool bVar1;
  size_type sVar2;
  JumpNot *this_00;
  Jump *this_01;
  reference element;
  size_t sVar3;
  reference ppJVar4;
  Element EVar5;
  Jump *p;
  iterator __end2_1;
  iterator __begin2_1;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  *__range2_1;
  size_t index;
  Jump *local_b0;
  Jump *jinst;
  uint_t uStack_a0;
  JumpNot *local_98;
  JumpNot *inst;
  Element *de;
  Element *be;
  size_t i;
  RIterator<unsigned_long> __end2;
  RIterator<unsigned_long> __begin2;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_58;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_48;
  Range<unsigned_long> *__range2;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_> recordJ;
  size_t count;
  Element *refelt_local;
  Node *node_local;
  InstructionCreater *this_local;
  
  sVar2 = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::size
                    (&node->
                      super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>);
  recordJ.
  super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((sVar2 >> 1) - 1);
  std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>::
  vector((vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
          *)&__range2);
  local_58 = (RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>)
             Common::range(1,(long)recordJ.
                                   super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  local_48 = &local_58;
  __end2 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_48);
  i = (size_t)Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_48);
  while( true ) {
    bVar1 = Common::RIterator<unsigned_long>::operator!=(&__end2,(RIterator<unsigned_long> *)&i);
    if (!bVar1) break;
    be = (Element *)Common::RIterator<unsigned_long>::operator*(&__end2);
    de = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                   (&node->
                     super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,
                    (size_type)be);
    inst = (JumpNot *)
           std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                     (&node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,
                      (long)&be->field_0 +
                      (long)recordJ.
                            super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    createReferNode(this,de);
    this_00 = (JumpNot *)operator_new(0x28);
    *(undefined8 *)&this_00->Data = 0;
    (this_00->Data).index = 0;
    (this_00->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.
    _vptr_InstructionData = (_func_int **)0x0;
    *(undefined8 *)
     &(this_00->super_InstDataBase<(ICM::Instruction::Instruction)32>).super_InstructionData.Inst =
         0;
    this_00->Index = 0;
    Instruction::Insts::JumpNot::JumpNot(this_00);
    local_98 = this_00;
    EVar5 = Instruction::ConvertToInstElement(de);
    uStack_a0 = EVar5.index;
    jinst._0_4_ = EVar5.field_0;
    *(ulong *)&local_98->Data = CONCAT44(jinst._4_4_,jinst._0_4_);
    (local_98->Data).index = uStack_a0;
    Instruction::InstructionList::push(&this->InstList,(InstructionData *)local_98);
    createReferNode(this,(Element *)inst);
    this_01 = (Jump *)operator_new(0x18);
    (this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
    _vptr_InstructionData = (_func_int **)0x0;
    *(undefined8 *)
     &(this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst =
         0;
    this_01->Index = 0;
    Instruction::Insts::Jump::Jump(this_01);
    local_b0 = this_01;
    std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>::
    push_back((vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
               *)&__range2,&local_b0);
    index = (size_t)local_b0;
    std::
    vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
    ::push_back(&(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ,(value_type *)&index);
    sVar3 = NextInstID(this);
    local_98->Index = sVar3;
    Common::RIterator<unsigned_long>::operator++(&__end2);
  }
  element = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::back
                      (&node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
  ;
  createReferNode(this,element);
  Instruction::InstructionList::push(&this->InstList,sing);
  sVar3 = CurrInstID(this);
  __end2_1 = std::
             vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
             ::begin((vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
                      *)&__range2);
  p = (Jump *)std::
              vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
              ::end((vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
                     *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<ICM::Instruction::Insts::Jump_**,_std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>_>
                        *)&p);
    if (!bVar1) break;
    ppJVar4 = __gnu_cxx::
              __normal_iterator<ICM::Instruction::Insts::Jump_**,_std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>_>
              ::operator*(&__end2_1);
    (*ppJVar4)->Index = sVar3;
    __gnu_cxx::
    __normal_iterator<ICM::Instruction::Insts::Jump_**,_std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>_>
    ::operator++(&__end2_1);
  }
  ASTBase::Element::setRefer(refelt,sVar3);
  std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>::
  ~vector((vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
           *)&__range2);
  return true;
}

Assistant:

bool createNodeIf(Node &node, Element &refelt) {
				size_t count = node.size() / 2 - 1;
				vector<Insts::Jump*> recordJ;
				for (size_t i : range(1, 1 + count)) {
					Element &be = node[i];
					Element &de = node[i + count];

					createReferNode(be);
					auto *inst = new Insts::JumpNot();
					inst->Data = ConvertToInstElement(be);
					InstList.push(inst);
					createReferNode(de);
					auto *jinst = new Insts::Jump();
					recordJ.push_back(jinst);
					InstList.push_back(jinst);
					inst->Index = NextInstID();
				}
				createReferNode(node.back());
				InstList.push(sing);
				size_t index = CurrInstID();
				for (auto *p : recordJ) {
					p->Index = index;
				}
				refelt.setRefer(index);
				return true;
			}